

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O3

void __thiscall AsyncRgbLedAnalyzer::~AsyncRgbLedAnalyzer(AsyncRgbLedAnalyzer *this)

{
  AsyncRgbLedAnalyzerResults *pAVar1;
  AsyncRgbLedAnalyzerSettings *pAVar2;
  
  *(undefined ***)this = &PTR__AsyncRgbLedAnalyzer_0010dc90;
  Analyzer::KillThread();
  AsyncRgbLedSimulationDataGenerator::~AsyncRgbLedSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  pAVar1 = (this->mResults)._M_t.
           super___uniq_ptr_impl<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
           ._M_t.
           super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerResults_*,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
           .super__Head_base<0UL,_AsyncRgbLedAnalyzerResults_*,_false>._M_head_impl;
  if (pAVar1 != (AsyncRgbLedAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pAVar1 + 8))();
  }
  (this->mResults)._M_t.
  super___uniq_ptr_impl<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
  ._M_t.
  super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerResults_*,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
  .super__Head_base<0UL,_AsyncRgbLedAnalyzerResults_*,_false>._M_head_impl =
       (AsyncRgbLedAnalyzerResults *)0x0;
  pAVar2 = (this->mSettings)._M_t.
           super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
           .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl;
  if (pAVar2 != (AsyncRgbLedAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pAVar2 + 8))();
  }
  (this->mSettings)._M_t.
  super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
  ._M_t.
  super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
  .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl =
       (AsyncRgbLedAnalyzerSettings *)0x0;
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

AsyncRgbLedAnalyzer::~AsyncRgbLedAnalyzer()
{
    KillThread();
}